

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_string_cursor_to_index(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp offset)

{
  byte bVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = (ulong)offset & 0xfffffffffffffffd;
  uVar6 = uVar8 + 7;
  if (-1 < (long)uVar8) {
    uVar6 = uVar8;
  }
  if ((((ulong)str & 3) != 0) || (str->tag != 9)) {
    psVar4 = sexp_type_exception(ctx,self,9,str);
    return psVar4;
  }
  if (((uint)offset & 7) != 2) {
    psVar4 = sexp_type_exception(ctx,self,0xf,offset);
    return psVar4;
  }
  if ((-8 < (long)uVar8) && ((long)uVar6 >> 3 <= (str->value).uvector.length)) {
    psVar4 = (sexp)&DAT_00000001;
    if (7 < (long)uVar8) {
      psVar2 = (str->value).type.name;
      psVar3 = (str->value).type.cpl;
      pbVar5 = (byte *)((psVar2->value).flonum_bits + (long)(psVar3->value).flonum_bits);
      psVar4 = (sexp)&DAT_00000001;
      do {
        bVar1 = *pbVar5;
        lVar7 = 1;
        if ((0xbf < bVar1) && (lVar7 = 2, 0xdf < bVar1)) {
          lVar7 = (ulong)((bVar1 >> 4 & 1) != 0) + 3;
        }
        pbVar5 = pbVar5 + lVar7;
        psVar4 = (sexp)((long)&psVar4->tag + 2);
      } while (pbVar5 < (psVar3->value).flonum_bits + (long)&psVar2->value + ((long)uVar6 >> 3));
    }
    return psVar4;
  }
  psVar4 = sexp_user_exception(ctx,self,"string-cursor->index: offset out of range",offset);
  return psVar4;
}

Assistant:

sexp sexp_string_cursor_to_index (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp offset) {
  sexp_sint_t off = sexp_unbox_string_cursor(offset);
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_string_cursorp, SEXP_STRING_CURSOR, offset);
  if (off < 0 || off > (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-cursor->index: offset out of range", offset);
#if SEXP_USE_STRING_REF_CACHE
  sexp_uint_t cached_idx = sexp_cached_char_idx(str);
  sexp_sint_t cached_off = sexp_unbox_string_cursor(sexp_cached_cursor(str));
  unsigned char* string_data = (unsigned char*)sexp_string_data(str);
  sexp_sint_t idx_delta;
  if (off >= cached_off) {
    idx_delta = sexp_string_utf8_length(string_data+cached_off, off-cached_off);
  } else {
    idx_delta = 0 - sexp_string_utf8_length(string_data+off, cached_off-off);
  }

  sexp_uint_t new_idx = cached_idx + idx_delta;
  sexp_cached_char_idx(str) = new_idx;
  sexp_cached_cursor(str) = offset;
  return sexp_make_fixnum(new_idx);
#else
  return sexp_make_fixnum(sexp_string_utf8_length((unsigned char*)sexp_string_data(str), off));
#endif
}